

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<int,phmap::priv::(anonymous_namespace)::balast>::
     transfer<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>
               (allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *alloc,
               slot_type *new_slot,slot_type *old_slot)

{
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *alloc_local;
  
  map_slot_policy<int,_phmap::priv::(anonymous_namespace)::balast>::emplace(new_slot);
  allocator_traits<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>
  ::
  construct<std::pair<int,phmap::priv::(anonymous_namespace)::balast>,std::pair<int,phmap::priv::(anonymous_namespace)::balast>>
            (alloc,(pair<int,_phmap::priv::(anonymous_namespace)::balast> *)&new_slot->value,
             (pair<int,_phmap::priv::(anonymous_namespace)::balast> *)&old_slot->value);
  destroy<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>
            (alloc,old_slot);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }